

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O3

WebSocketMsg __thiscall asl::WebSocket::receive(WebSocket *this)

{
  AtomicCount *pAVar1;
  SmartObject_ *pSVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  Array<unsigned_char> AVar6;
  int iVar7;
  int iVar8;
  ushort uVar9;
  ulong uVar10;
  long lVar11;
  WebSocket *in_RSI;
  int in_R8D;
  uint uVar12;
  byte mlen;
  byte b0;
  uint mask;
  byte local_52;
  byte local_51;
  Array<unsigned_char> local_50;
  Array<unsigned_char> local_48;
  uint local_40 [3];
  uint local_34;
  
  Array<unsigned_char>::alloc(&local_50,0);
  do {
    Array<unsigned_char>::alloc(&local_48,0);
    if (in_RSI->_closed != false) {
LAB_001290eb:
      WebSocketMsg::fix((WebSocketMsg *)&local_50);
LAB_001290f5:
      (this->_socket).super_SmartObject._p = (SmartObject_ *)local_50._a;
      LOCK();
      ((AtomicCount *)(local_50._a + -8))->n = ((AtomicCount *)(local_50._a + -8))->n + 1;
      UNLOCK();
      bVar3 = false;
      bVar4 = false;
      goto LAB_00129106;
    }
    iVar7 = (*((in_RSI->_socket).super_SmartObject._p)->_vptr_SmartObject_[5])();
    if ((char)iVar7 != '\0') {
      in_RSI->_closed = true;
      (*((in_RSI->_socket).super_SmartObject._p)->_vptr_SmartObject_[0xb])();
      goto LAB_001290eb;
    }
    (*((in_RSI->_socket).super_SmartObject._p)->_vptr_SmartObject_[0xc])();
    pSVar2 = (in_RSI->_socket).super_SmartObject._p;
    (*pSVar2->_vptr_SmartObject_[0xd])(pSVar2,&local_51,1);
    pSVar2 = (in_RSI->_socket).super_SmartObject._p;
    (*pSVar2->_vptr_SmartObject_[0xd])(pSVar2,&local_52,1);
    if (in_RSI->_closed != false) {
LAB_00129183:
      WebSocketMsg::fix((WebSocketMsg *)&local_50);
      goto LAB_001290f5;
    }
    iVar7 = (*((in_RSI->_socket).super_SmartObject._p)->_vptr_SmartObject_[5])();
    bVar5 = local_52;
    if ((char)iVar7 != '\0') {
      in_RSI->_closed = true;
      (*((in_RSI->_socket).super_SmartObject._p)->_vptr_SmartObject_[0xb])();
      goto LAB_00129183;
    }
    local_34 = (uint)local_51;
    uVar12 = local_52 & 0x7f;
    if (uVar12 == 0x7e) {
      pSVar2 = (in_RSI->_socket).super_SmartObject._p;
      (*pSVar2->_vptr_SmartObject_[0xd])(pSVar2,local_40,2);
      uVar9 = (ushort)local_40[0] << 8 | (ushort)local_40[0] >> 8;
      if (*(int *)((long)&(in_RSI->_socket).super_SmartObject._p[1]._vptr_SmartObject_ + 4) != 0) {
        uVar9 = (ushort)local_40[0];
      }
      uVar12 = (uint)uVar9;
    }
    else if ((char)uVar12 == '\x7f') {
      Socket::operator>>(&in_RSI->_socket,(longlong *)local_40);
      uVar12 = local_40[0];
    }
    local_40[0] = 0;
    if ((char)bVar5 < '\0') {
      Socket::operator>>(&in_RSI->_socket,local_40);
    }
    lVar11 = (long)(int)uVar12 +
             (long)*(int *)&((SmartObject_ *)(local_48._a + -0x10))->_vptr_SmartObject_;
    iVar7 = (int)lVar11;
    Array<unsigned_char>::reserve(&local_48,iVar7);
    *(int *)&((SmartObject_ *)(local_48._a + -0x10))->_vptr_SmartObject_ = iVar7;
    if (0 < (int)uVar12) {
      pSVar2 = (in_RSI->_socket).super_SmartObject._p;
      (*pSVar2->_vptr_SmartObject_[0xd])
                (pSVar2,local_48._a + (lVar11 - (ulong)uVar12),(ulong)uVar12);
    }
    if ((char)bVar5 < '\0') {
      local_40[0] = local_40[0] >> 0x18 | (local_40[0] & 0xff0000) >> 8 |
                    (local_40[0] & 0xff00) << 8 | local_40[0] << 0x18;
      iVar7 = *(int *)&((SmartObject_ *)(local_48._a + -0x10))->_vptr_SmartObject_;
      Array<unsigned_char>::reserve(&local_48,iVar7 + 4);
      *(int *)&((SmartObject_ *)(local_48._a + -0x10))->_vptr_SmartObject_ = iVar7 + 4;
      Array<unsigned_char>::reserve(&local_48,iVar7);
      *(int *)&((SmartObject_ *)(local_48._a + -0x10))->_vptr_SmartObject_ = iVar7;
      if (-4 < iVar7) {
        iVar8 = iVar7 + 3;
        if (-1 < iVar7) {
          iVar8 = iVar7;
        }
        uVar10 = 0;
        do {
          *(uint *)(local_48._a + uVar10 * 4) = *(uint *)(local_48._a + uVar10 * 4) ^ local_40[0];
          uVar10 = uVar10 + 1;
        } while ((iVar8 >> 2) + 1 != uVar10);
      }
    }
    bVar5 = 0;
    switch(local_34 & 0xf) {
    case 0:
    case 1:
    case 2:
      Array<unsigned_char>::append(&local_50,&local_48);
      break;
    default:
      goto switchD_001292d4_caseD_3;
    case 8:
      if (1 < *(int *)&((SmartObject_ *)(local_48._a + -0x10))->_vptr_SmartObject_) {
        in_RSI->_code = (uint)(ushort)(*(ushort *)local_48._a << 8 | *(ushort *)local_48._a >> 8);
        Array<unsigned_char>::remove(&local_48,(char *)0x0);
        AVar6._a = local_48._a;
        LOCK();
        ((AtomicCount *)(local_48._a + -8))->n = ((AtomicCount *)(local_48._a + -8))->n + 1;
        UNLOCK();
        if (local_50._a != local_48._a) {
          LOCK();
          pAVar1 = (AtomicCount *)(local_50._a + -8);
          pAVar1->n = pAVar1->n + -1;
          UNLOCK();
          if (pAVar1->n == 0) {
            free((SmartObject_ *)(local_50._a + -0x10));
          }
          local_50._a = AVar6._a;
          LOCK();
          ((AtomicCount *)(AVar6._a + -8))->n = ((AtomicCount *)(AVar6._a + -8))->n + 1;
          UNLOCK();
        }
        pAVar1 = (AtomicCount *)(AVar6._a + -8);
        LOCK();
        pAVar1->n = pAVar1->n + -1;
        UNLOCK();
        if (pAVar1->n == 0) {
          free((SmartObject_ *)(AVar6._a + -0x10));
        }
      }
      in_RSI->_closed = true;
      bVar5 = 1;
      (*((in_RSI->_socket).super_SmartObject._p)->_vptr_SmartObject_[0xb])();
      goto switchD_001292d4_caseD_3;
    case 9:
      send(in_RSI,(int)local_48._a,
           (void *)(ulong)*(uint *)&((SmartObject_ *)(local_48._a + -0x10))->_vptr_SmartObject_,10,
           in_R8D);
      break;
    case 10:
      Array<unsigned_char>::reserve(&local_48,0);
      *(undefined4 *)&((SmartObject_ *)(local_48._a + -0x10))->_vptr_SmartObject_ = 0;
    }
    bVar5 = 0;
switchD_001292d4_caseD_3:
    bVar4 = (bool)((char)local_34 < '\0' | bVar5);
    bVar3 = true;
LAB_00129106:
    LOCK();
    pAVar1 = (AtomicCount *)(local_48._a + -8);
    pAVar1->n = pAVar1->n + -1;
    UNLOCK();
    if (pAVar1->n == 0) {
      free((SmartObject_ *)(local_48._a + -0x10));
    }
    if (!bVar3) goto LAB_001293c6;
  } while (!bVar4);
  WebSocketMsg::fix((WebSocketMsg *)&local_50);
  (this->_socket).super_SmartObject._p = (SmartObject_ *)local_50._a;
  LOCK();
  ((AtomicCount *)(local_50._a + -8))->n = ((AtomicCount *)(local_50._a + -8))->n + 1;
  UNLOCK();
LAB_001293c6:
  LOCK();
  pAVar1 = (AtomicCount *)(local_50._a + -8);
  pAVar1->n = pAVar1->n + -1;
  UNLOCK();
  if (pAVar1->n == 0) {
    free((SmartObject_ *)(local_50._a + -0x10));
  }
  return (WebSocketMsg)(ByteArray)this;
}

Assistant:

WebSocketMsg WebSocket::receive()
{
	WebSocketMsg msg;
	bool haveMsg = false;
	while (!haveMsg)
	{
		ByteArray buffer;
		byte b0, mlen;
		DEBUG_LOG("receive\n");
		if (closed()) {
			return msg.fix();
		}
		DEBUG_LOG("avail %i\n", _socket.available());
		_socket >> b0 >> mlen;
		DEBUG_LOG("%i %i\n", b0, mlen);
		if (closed()) {
			return msg.fix();
		}
		bool fin = !!(b0 & 0x80);
		int opcode = b0 & 0x0f;
		bool masked = !!(mlen & 0x80);
		int len = mlen & 0x7f;
		if (len == 126)
		{
			len = _socket.read<unsigned short>();
		}
		else if (len == 127)
			len = (int)_socket.read<Long>(); // what if length larger than int?

		unsigned mask = 0;
		if (masked)
			_socket >> mask;

		buffer.resize(buffer.length() + len);
		if (len > 0)
			_socket.read(buffer.data() + buffer.length() - len, len);

		DEBUG_LOG("frame: op %i fin %i len %i\n", opcode, fin ? 1 : 0, (int)len);

		if (masked)
		{
			swapBytes(mask);
			buffer.resize(buffer.length() + 4);
			buffer.resize(buffer.length() - 4);
			int n = buffer.length() / 4 + 1;
			for (int i = 0; i < n; i++)
			{
				((unsigned*)buffer.data())[i] ^= mask;
			}
		}

		switch (opcode)
		{
		case 0: // continuation
		case 1: // text
		case 2: // binary
			msg.append(buffer);
			break;
		case 8: // connection close
		{
			if (buffer.length() >= 2) {
				_code = (buffer[0] << 8) | buffer[1];
				buffer.remove(0, 2);
				msg = buffer;
			}
			haveMsg = true;
			_closed = true;
			_socket.close();
			break;
		}
		case 9: // ping
			send(buffer.data(), buffer.length(), FRAME_PONG);
			break;
		case 10: // pong
			buffer.clear();
			break;
		}

		if (fin)
			haveMsg = true;
	}

	return msg.fix();
}